

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int __thiscall
fmt::v9::basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>::get_id<char>
          (basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *this,
          basic_string_view<char> name)

{
  value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *pvVar1;
  char *__s;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  basic_string_view<char> lhs;
  
  if ((this->desc_ >> 0x3e & 1) != 0) {
    pvVar1 = (this->field_1).values_;
    uVar5 = (ulong)(-1 < (long)this->desc_) << 4 | 0xffffffffffffffe0;
    lVar4 = 0;
    for (uVar6 = 0; uVar6 < *(ulong *)((long)&pvVar1->field_0 + uVar5 + 8); uVar6 = uVar6 + 1) {
      __s = *(char **)(*(long *)((long)&pvVar1->field_0 + uVar5) + lVar4);
      sVar3 = strlen(__s);
      lhs.size_ = sVar3;
      lhs.data_ = __s;
      bVar2 = operator==(lhs,name);
      if (bVar2) {
        return *(int *)(*(long *)((long)&pvVar1->field_0 + uVar5) + 8 + lVar4);
      }
      lVar4 = lVar4 + 0x10;
    }
  }
  return -1;
}

Assistant:

auto get_id(basic_string_view<Char> name) const -> int {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }